

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_colr_v2(opj_jp2_v2_t *jp2,uchar *p_colr_header_data,OPJ_UINT32 p_colr_header_size,
                         opj_event_mgr_t *p_manager)

{
  int iVar1;
  void *pvVar2;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  int icc_len;
  int it_icc_value;
  OPJ_UINT32 l_value;
  int local_30;
  OPJ_UINT32 local_2c;
  opj_event_mgr_t *local_28;
  uint local_1c;
  OPJ_BYTE *local_18;
  long local_10;
  opj_bool local_4;
  
  if (in_EDX < 3) {
    opj_event_msg_v2(in_RCX,1,"Bad COLR header box (bad size)\n");
    local_4 = 0;
  }
  else if (*(char *)(in_RDI + 0x90) == '\0') {
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    opj_read_bytes_LE(in_RSI,(OPJ_UINT32 *)(in_RDI + 0x34),1);
    local_18 = local_18 + 1;
    opj_read_bytes_LE(local_18,(OPJ_UINT32 *)(local_10 + 0x40),1);
    local_18 = local_18 + 1;
    opj_read_bytes_LE(local_18,(OPJ_UINT32 *)(local_10 + 0x38),1);
    local_18 = local_18 + 1;
    if (*(int *)(local_10 + 0x34) == 1) {
      if (local_1c != 7) {
        opj_event_msg_v2(local_28,1,"Bad BPCC header box (bad size)\n");
        return 0;
      }
      opj_read_bytes_LE(local_18,(OPJ_UINT32 *)(local_10 + 0x3c),4);
    }
    else if (*(int *)(local_10 + 0x34) == 2) {
      iVar1 = local_1c - 3;
      *(int *)(local_10 + 0x78) = iVar1;
      pvVar2 = malloc((long)iVar1);
      *(void **)(local_10 + 0x70) = pvVar2;
      memset(*(void **)(local_10 + 0x70),0,(long)iVar1);
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        opj_read_bytes_LE(local_18,&local_2c,1);
        local_18 = local_18 + 1;
        *(char *)(*(long *)(local_10 + 0x70) + (long)local_30) = (char)local_2c;
      }
    }
    else {
      opj_event_msg_v2(local_28,4,
                       "COLR BOX meth value is not a regular value (%d), so we will skip the fields following the approx field.\n"
                       ,(ulong)*(uint *)(local_10 + 0x34));
    }
    *(undefined1 *)(local_10 + 0x90) = 1;
    local_4 = 1;
  }
  else {
    opj_event_msg_v2(in_RCX,4,
                     "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n"
                    );
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static opj_bool jp2_read_colr_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_colr_header_data,
							OPJ_UINT32 p_colr_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_colr_header_data != 00);
	assert(p_manager != 00);

	if (p_colr_header_size < 3) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Bad COLR header box (bad size)\n");
		return OPJ_FALSE;
	}

	/* Part 1, I.5.3.3 : 'A conforming JP2 reader shall ignore all Colour
	 * Specification boxes after the first.'
	*/
	if(jp2->color.jp2_has_colr) {
		opj_event_msg_v2(p_manager, EVT_INFO, "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n");
		p_colr_header_data += p_colr_header_size;
		return OPJ_TRUE;
	}

	opj_read_bytes(p_colr_header_data,&jp2->meth ,1);			/* METH */
	++p_colr_header_data;

	opj_read_bytes(p_colr_header_data,&jp2->precedence ,1);		/* PRECEDENCE */
	++p_colr_header_data;

	opj_read_bytes(p_colr_header_data,&jp2->approx ,1);			/* APPROX */
	++p_colr_header_data;

	if (jp2->meth == 1) {
		if (p_colr_header_size != 7) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Bad BPCC header box (bad size)\n");
			return OPJ_FALSE;
		}

		opj_read_bytes(p_colr_header_data,&jp2->enumcs ,4);			/* EnumCS */
	}
	else if (jp2->meth == 2) {
		/* ICC profile */
		int it_icc_value = 0;
		int icc_len = p_colr_header_size - 3;

		jp2->color.icc_profile_len = icc_len;
		jp2->color.icc_profile_buf = (unsigned char*) opj_malloc(icc_len);

		memset(jp2->color.icc_profile_buf, 0, icc_len * sizeof(unsigned char));

		for (it_icc_value = 0; it_icc_value < icc_len; ++it_icc_value)
		{
			opj_read_bytes(p_colr_header_data,&l_value,1);		/* icc values */
			++p_colr_header_data;
			jp2->color.icc_profile_buf[it_icc_value] = (OPJ_BYTE) l_value;
		}

	}
	else /* TODO MSD */
		opj_event_msg_v2(p_manager, EVT_INFO, "COLR BOX meth value is not a regular value (%d), so we will skip the fields following the approx field.\n", jp2->meth);

	jp2->color.jp2_has_colr = 1;

	return OPJ_TRUE;
}